

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::Type::GetDecorationStr_abi_cxx11_
          (string *__return_storage_ptr__,Type *this)

{
  bool bVar1;
  reference this_00;
  size_type sVar2;
  const_reference pvVar3;
  char *pcVar4;
  ulong local_1b8;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *decoration;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  ostringstream oss;
  Type *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2);
  std::operator<<((ostream *)&__range2,"[[");
  __end2 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(&this->decorations_);
  decoration = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::end(&this->decorations_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&decoration);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end2);
    std::operator<<((ostream *)&__range2,"(");
    local_1b8 = 0;
    while( true ) {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      if (sVar2 <= local_1b8) break;
      pcVar4 = "";
      if (local_1b8 != 0) {
        pcVar4 = ", ";
      }
      std::operator<<((ostream *)&__range2,pcVar4);
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(this_00,local_1b8);
      std::ostream::operator<<(&__range2,*pvVar3);
      local_1b8 = local_1b8 + 1;
    }
    std::operator<<((ostream *)&__range2,")");
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end2);
  }
  std::operator<<((ostream *)&__range2,"]]");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

std::string Type::GetDecorationStr() const {
  std::ostringstream oss;
  oss << "[[";
  for (const auto& decoration : decorations_) {
    oss << "(";
    for (size_t i = 0; i < decoration.size(); ++i) {
      oss << (i > 0 ? ", " : "");
      oss << decoration.at(i);
    }
    oss << ")";
  }
  oss << "]]";
  return oss.str();
}